

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codadump-debug.c
# Opt level: O2

void print_data(coda_cursor *cursor,int depth)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  undefined8 uVar4;
  long lVar5;
  coda_cursor *pcVar6;
  long lVar7;
  long *plVar8;
  coda_native_type cVar9;
  int64_t iVar10;
  size_t sVar11;
  long lVar12;
  int has_ascii_content;
  int iStack_3c4;
  char *field_name;
  int64_t data_3;
  coda_native_type read_type;
  undefined4 uStack_394;
  long local_378;
  int local_370;
  int is_union;
  int has_attributes;
  coda_type_class type_class;
  ulong local_360;
  int64_t offset;
  coda_cursor *local_350;
  long length;
  
  uVar3 = (ulong)(uint)depth;
  iVar1 = coda_cursor_has_attributes(cursor,&has_attributes);
  if (iVar1 != 0) {
    handle_coda_error();
  }
  if (has_attributes != 0) {
    iVar1 = coda_cursor_goto_attributes(cursor);
    if (iVar1 != 0) {
      handle_coda_error();
    }
    fi_printf("{attributes}\n");
    INDENT = INDENT + 1;
    print_data(cursor,depth);
    INDENT = INDENT + -1;
    coda_cursor_goto_parent(cursor);
  }
  iVar1 = coda_cursor_get_type_class(cursor,&type_class);
  if (iVar1 != 0) {
    handle_coda_error();
  }
  local_360 = uVar3;
  switch(type_class) {
  case coda_record_class:
    iVar1 = coda_cursor_get_num_elements(cursor,&data_3);
    if (iVar1 != 0) {
      handle_coda_error();
    }
    if (data_3 < 1) {
      return;
    }
    iVar1 = coda_cursor_get_type(cursor,&read_type);
    if (iVar1 != 0) {
      handle_coda_error();
    }
    iVar1 = coda_type_get_record_union_status(CONCAT44(uStack_394,read_type),&is_union);
    if (iVar1 != 0) {
      handle_coda_error();
    }
    if (is_union == 0) {
      iVar1 = coda_cursor_goto_first_record_field(cursor);
      if (iVar1 != 0) {
        handle_coda_error();
      }
      local_378 = CONCAT44(local_378._4_4_,depth + 1);
      for (lVar12 = 0; lVar12 < data_3; lVar12 = lVar12 + 1) {
        iVar1 = coda_type_get_record_field_name
                          (CONCAT44(uStack_394,read_type),lVar12,&has_ascii_content);
        if (iVar1 != 0) {
          handle_coda_error();
        }
        fi_printf("[%s]",CONCAT44(iStack_3c4,has_ascii_content));
        if (print_offsets != 0) {
          iVar1 = coda_cursor_get_file_bit_offset(cursor,&field_name);
          if (iVar1 != 0) {
            handle_coda_error();
          }
          if (-1 < field_name._4_4_) {
            coda_str64(CONCAT44(field_name._4_4_,(uint)field_name) >> 3,&length);
            ff_printf(":%s",&length);
            if (((uint)field_name & 7) != 0) {
              ff_printf(":%d");
            }
          }
        }
        ff_printf("\n");
        INDENT = INDENT + 1;
        if (max_depth < 0 || (int)local_360 < max_depth) {
          print_data(cursor,(int)local_378);
        }
        else {
          fi_printf("...\n");
        }
        INDENT = INDENT + -1;
        if ((lVar12 < data_3 + -1) &&
           (iVar1 = coda_cursor_goto_next_record_field(cursor), iVar1 != 0)) {
          handle_coda_error();
        }
      }
    }
    else {
      iVar1 = coda_cursor_get_available_union_field_index(cursor,&has_ascii_content);
      if (iVar1 != 0) {
        handle_coda_error();
      }
      iVar1 = coda_type_get_record_field_name
                        (CONCAT44(uStack_394,read_type),CONCAT44(iStack_3c4,has_ascii_content),
                         &field_name);
      if (iVar1 != 0) {
        handle_coda_error();
      }
      iVar1 = coda_cursor_goto_record_field_by_index(cursor,CONCAT44(iStack_3c4,has_ascii_content));
      if (iVar1 != 0) {
        handle_coda_error();
      }
      fi_printf("[%s]",CONCAT44(field_name._4_4_,(uint)field_name));
      if (print_offsets != 0) {
        iVar1 = coda_cursor_get_file_bit_offset(cursor,&offset);
        if (iVar1 != 0) {
          handle_coda_error();
        }
        if (-1 < offset) {
          coda_str64((ulong)offset >> 3,&length);
          ff_printf(":%s",&length);
          if ((offset & 7U) != 0) {
            ff_printf(":%d");
          }
        }
      }
      ff_printf("\n");
      INDENT = INDENT + 1;
      if (max_depth < 0 || depth < max_depth) {
        print_data(cursor,depth + 1);
      }
      else {
        fi_printf("...\n");
      }
      INDENT = INDENT + -1;
    }
    goto LAB_00104b9b;
  case coda_array_class:
    iVar1 = coda_cursor_get_array_dim(cursor,&field_name,&length);
    if (iVar1 != 0) {
      handle_coda_error();
    }
    if ((long)(int)(uint)field_name < 0) {
      return;
    }
    lVar12 = 1;
    for (lVar5 = 0; (int)(uint)field_name != lVar5; lVar5 = lVar5 + 1) {
      lVar12 = lVar12 * (&length)[lVar5];
      *(undefined4 *)((long)&data_3 + lVar5 * 4) = 0;
    }
    if (lVar12 < 1) {
      return;
    }
    iVar1 = coda_cursor_goto_first_array_element(cursor);
    if (iVar1 != 0) {
      handle_coda_error();
    }
    local_370 = depth + 1;
    local_378 = lVar12 + -1;
    local_350 = cursor;
    for (lVar5 = 0; lVar5 != lVar12; lVar5 = lVar5 + 1) {
      fi_printf("(");
      for (lVar7 = 0; lVar7 < (int)(uint)field_name; lVar7 = lVar7 + 1) {
        ff_printf("%d",(ulong)*(uint *)((long)&data_3 + lVar7 * 4));
        if (lVar7 < (long)(int)(uint)field_name + -1) {
          ff_printf(",");
        }
      }
      ff_printf(")");
      uVar3 = local_360;
      if (print_offsets != 0) {
        iVar1 = coda_cursor_get_file_bit_offset(cursor,&has_ascii_content);
        if (iVar1 != 0) {
          handle_coda_error();
        }
        if (-1 < iStack_3c4) {
          coda_str64(CONCAT44(iStack_3c4,has_ascii_content) >> 3,&read_type);
          ff_printf(":%s",&read_type);
          cursor = local_350;
          if ((has_ascii_content & 7U) != 0) {
            ff_printf(":%d");
            cursor = local_350;
          }
        }
      }
      ff_printf("\n");
      INDENT = INDENT + 1;
      if (max_depth < 0 || (int)uVar3 < max_depth) {
        print_data(cursor,local_370);
      }
      else {
        fi_printf("...\n");
      }
      INDENT = INDENT + -1;
      for (uVar3 = (ulong)(uint)field_name;
          (0 < (int)uVar3 &&
          (pcVar6 = (coda_cursor *)((long)*(int *)((long)&field_name + uVar3 * 4 + 4) + 1),
          *(int *)((long)&field_name + uVar3 * 4 + 4) = (int)pcVar6, (&local_350)[uVar3] == pcVar6))
          ; uVar3 = uVar3 - 1) {
        *(undefined4 *)((long)&field_name + uVar3 * 4 + 4) = 0;
      }
      if ((lVar5 < local_378) && (iVar1 = coda_cursor_goto_next_array_element(cursor), iVar1 != 0))
      {
        handle_coda_error();
      }
    }
LAB_00104b9b:
    coda_cursor_goto_parent(cursor);
    return;
  case coda_integer_class:
  case coda_real_class:
  case coda_text_class:
  case coda_raw_class:
    iVar1 = coda_cursor_has_ascii_content(cursor,&has_ascii_content);
    if (iVar1 != 0) {
      handle_coda_error();
    }
    if (has_ascii_content != 0) {
      iVar1 = coda_cursor_get_string_length(cursor,&length);
      if (iVar1 != 0) {
        handle_coda_error();
      }
      sVar11 = CONCAT44(length._4_4_,(uint)length) + 1;
      pcVar2 = (char *)malloc(sVar11);
      if (pcVar2 == (char *)0x0) {
        coda_set_error(0xffffffffffffffff,"out of memory (could not allocate %lu bytes) (%s:%u)",
                       sVar11,
                       "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/tools/codadump/codadump-debug.c"
                       ,0x19a);
        handle_coda_error();
        sVar11 = CONCAT44(length._4_4_,(uint)length) + 1;
      }
      iVar1 = coda_cursor_read_string(cursor,pcVar2,sVar11);
      if (iVar1 != 0) {
        handle_coda_error();
      }
      fi_printf("\"");
      print_escaped(pcVar2,CONCAT44(length._4_4_,(uint)length));
      ff_printf("\" (length=%ld)\n",CONCAT44(length._4_4_,(uint)length));
      free(pcVar2);
    }
    iVar1 = coda_cursor_get_read_type(cursor,&read_type);
    if (iVar1 != 0) {
      handle_coda_error();
    }
    break;
  case coda_special_class:
    iVar1 = coda_cursor_get_special_type(cursor,&read_type);
    if (iVar1 != 0) {
      handle_coda_error();
    }
    if (read_type == coda_native_type_int8) {
      cVar9 = coda_native_type_int8;
    }
    else {
      memcpy(&length,cursor,0x310);
      iVar1 = coda_cursor_use_base_type_of_special_type(&length);
      if (iVar1 != 0) {
        handle_coda_error();
      }
      print_data((coda_cursor *)&length,depth);
      cVar9 = read_type;
    }
    uVar4 = coda_type_get_special_type_name(cVar9);
    fi_printf("<%s>",uVar4);
    switch(read_type) {
    case coda_native_type_int8:
      pcVar2 = "\n";
      goto LAB_0010480a;
    case coda_native_type_uint8:
      iVar1 = coda_cursor_read_double(cursor,&length);
      if (iVar1 != 0) {
        handle_coda_error();
      }
      data_3 = CONCAT44(length._4_4_,(uint)length);
      pcVar2 = "%.16g\n";
LAB_00104b7e:
      ff_printf(pcVar2,data_3);
      break;
    case coda_native_type_int16:
      iVar1 = coda_cursor_read_double(cursor,&data_3);
      if (iVar1 != 0) {
        handle_coda_error();
      }
      iVar1 = coda_isNaN(data_3);
      if ((iVar1 != 0) || (iVar1 = coda_isInf(data_3), iVar1 != 0)) {
        pcVar2 = " %.16g\n";
        goto LAB_00104b7e;
      }
      iVar1 = coda_time_double_to_string(data_3,"yyyy-MM-dd HH:mm:ss.SSSSSS",&length);
      if (iVar1 == 0) {
        ff_printf(" %s\n",&length);
        return;
      }
      pcVar2 = " {--invalid time value--}\n";
LAB_0010480a:
      ff_printf(pcVar2);
      break;
    case coda_native_type_uint16:
      iVar1 = coda_cursor_read_complex_double_split(cursor,&length,&data_3);
      if (iVar1 != 0) {
        handle_coda_error();
      }
      ff_printf(" %g + %gi\n",CONCAT44(length._4_4_,(uint)length),data_3);
    }
  default:
    goto switchD_00104253_default;
  }
  switch(read_type) {
  case coda_native_type_int8:
  case coda_native_type_int16:
  case coda_native_type_int32:
    iVar1 = coda_cursor_read_int32(cursor,&length);
    if (iVar1 != 0) {
      handle_coda_error();
    }
    plVar8 = (long *)(long)(int)(uint)length;
    pcVar2 = "%ld\n";
    goto LAB_00104984;
  case coda_native_type_uint8:
  case coda_native_type_uint16:
  case coda_native_type_uint32:
    iVar1 = coda_cursor_read_uint32(cursor,&length);
    if (iVar1 != 0) {
      handle_coda_error();
    }
    plVar8 = (long *)(ulong)(uint)length;
    pcVar2 = "%lu\n";
    goto LAB_00104984;
  case coda_native_type_int64:
    iVar1 = coda_cursor_read_int64(cursor,&data_3);
    if (iVar1 != 0) {
      handle_coda_error();
    }
    coda_str64(data_3,&length);
    goto LAB_0010497a;
  case coda_native_type_uint64:
    iVar1 = coda_cursor_read_uint64(cursor,&data_3);
    if (iVar1 != 0) {
      handle_coda_error();
    }
    coda_str64u(data_3,&length);
LAB_0010497a:
    plVar8 = &length;
    pcVar2 = "%s\n";
LAB_00104984:
    fi_printf(pcVar2,plVar8);
    break;
  case coda_native_type_float:
  case coda_native_type_double:
    iVar1 = coda_cursor_read_double(cursor,&length);
    if (iVar1 != 0) {
      handle_coda_error();
    }
    pcVar2 = "%.16g\n";
    if (read_type == coda_native_type_float) {
      pcVar2 = "%.7g\n";
    }
    fi_printf(pcVar2,CONCAT44(length._4_4_,(uint)length));
    break;
  case coda_native_type_bytes:
    iVar1 = coda_cursor_get_bit_size(cursor,&data_3);
    if (iVar1 != 0) {
      handle_coda_error();
    }
    iVar10 = data_3;
    sVar11 = ((data_3 >> 3) + 1) - (ulong)((data_3 & 7U) == 0);
    pcVar2 = (char *)malloc(sVar11);
    if (pcVar2 == (char *)0x0) {
      coda_set_error(0xffffffffffffffff,"out of memory (could not allocate %lu bytes) (%s:%u)",
                     sVar11,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/tools/codadump/codadump-debug.c"
                     ,0x1bf);
      handle_coda_error();
      iVar10 = data_3;
    }
    iVar1 = coda_cursor_read_bits(cursor,pcVar2,0,iVar10);
    if (iVar1 != 0) {
      handle_coda_error();
    }
    fi_printf("\"");
    print_escaped(pcVar2,sVar11);
    ff_printf("\" (size=");
    coda_str64(data_3 >> 3,&length);
    ff_printf("%s",&length);
    if ((data_3 & 7U) != 0) {
      ff_printf(":%d");
    }
    ff_printf(")\n");
    free(pcVar2);
    break;
  case coda_native_type_not_available:
  case coda_native_type_char:
  case coda_native_type_string:
    if (has_ascii_content == 0) {
      __assert_fail("has_ascii_content",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/tools/codadump/codadump-debug.c"
                    ,0x224,"void print_data(coda_cursor *, int)");
    }
  }
switchD_00104253_default:
  return;
}

Assistant:

static void print_data(coda_cursor *cursor, int depth)
{
    coda_type_class type_class;
    int has_attributes;

    if (coda_cursor_has_attributes(cursor, &has_attributes) != 0)
    {
        handle_coda_error();
    }
    if (has_attributes)
    {
        if (coda_cursor_goto_attributes(cursor) != 0)
        {
            handle_coda_error();
        }
        fi_printf("{attributes}\n");
        INDENT++;
        print_data(cursor, depth);
        INDENT--;
        coda_cursor_goto_parent(cursor);
    }

    if (coda_cursor_get_type_class(cursor, &type_class) != 0)
    {
        handle_coda_error();
    }
    switch (type_class)
    {
        case coda_record_class:
            {
                long num_fields;

                if (coda_cursor_get_num_elements(cursor, &num_fields) != 0)
                {
                    handle_coda_error();
                }
                if (num_fields > 0)
                {
                    coda_type *record_type;
                    int is_union;
                    long i;

                    if (coda_cursor_get_type(cursor, &record_type) != 0)
                    {
                        handle_coda_error();
                    }

                    if (coda_type_get_record_union_status(record_type, &is_union) != 0)
                    {
                        handle_coda_error();
                    }
                    if (is_union)
                    {
                        const char *field_name;

                        if (coda_cursor_get_available_union_field_index(cursor, &i) != 0)
                        {
                            handle_coda_error();
                        }
                        if (coda_type_get_record_field_name(record_type, i, &field_name) != 0)
                        {
                            handle_coda_error();
                        }
                        if (coda_cursor_goto_record_field_by_index(cursor, i) != 0)
                        {
                            handle_coda_error();
                        }
                        fi_printf("[%s]", field_name);
                        if (print_offsets)
                        {
                            int64_t offset;

                            if (coda_cursor_get_file_bit_offset(cursor, &offset) != 0)
                            {
                                handle_coda_error();
                            }
                            if (offset >= 0)
                            {
                                char s[21];

                                coda_str64(offset >> 3, s);
                                ff_printf(":%s", s);
                                if ((offset & 0x7) != 0)
                                {
                                    ff_printf(":%d", (int)(offset & 0x7));
                                }
                            }
                        }
                        ff_printf("\n");
                        INDENT++;
                        if (max_depth < 0 || depth < max_depth)
                        {
                            print_data(cursor, depth + 1);
                        }
                        else
                        {
                            fi_printf("...\n");
                        }
                        INDENT--;
                        coda_cursor_goto_parent(cursor);
                    }
                    else
                    {
                        if (coda_cursor_goto_first_record_field(cursor) != 0)
                        {
                            handle_coda_error();
                        }
                        for (i = 0; i < num_fields; i++)
                        {
                            const char *field_name;

                            if (coda_type_get_record_field_name(record_type, i, &field_name) != 0)
                            {
                                handle_coda_error();
                            }
                            fi_printf("[%s]", field_name);
                            if (print_offsets)
                            {
                                int64_t offset;

                                if (coda_cursor_get_file_bit_offset(cursor, &offset) != 0)
                                {
                                    handle_coda_error();
                                }
                                if (offset >= 0)
                                {
                                    char s[21];

                                    coda_str64(offset >> 3, s);
                                    ff_printf(":%s", s);
                                    if ((offset & 0x7) != 0)
                                    {
                                        ff_printf(":%d", (int)(offset & 0x7));
                                    }
                                }
                            }
                            ff_printf("\n");
                            INDENT++;
                            if (max_depth < 0 || depth < max_depth)
                            {
                                print_data(cursor, depth + 1);
                            }
                            else
                            {
                                fi_printf("...\n");
                            }
                            INDENT--;
                            if (i < num_fields - 1)
                            {
                                if (coda_cursor_goto_next_record_field(cursor) != 0)
                                {
                                    handle_coda_error();
                                }
                            }
                        }
                        coda_cursor_goto_parent(cursor);
                    }
                }
            }
            break;
        case coda_array_class:
            {
                long dim[CODA_MAX_NUM_DIMS];
                int num_dims;
                long num_elements;

                if (coda_cursor_get_array_dim(cursor, &num_dims, dim) != 0)
                {
                    handle_coda_error();
                }
                if (num_dims >= 0)
                {
                    int index[CODA_MAX_NUM_DIMS];
                    int i;

                    num_elements = 1;
                    for (i = 0; i < num_dims; i++)
                    {
                        num_elements *= dim[i];
                        index[i] = 0;
                    }
                    if (num_elements > 0)
                    {
                        if (coda_cursor_goto_first_array_element(cursor) != 0)
                        {
                            handle_coda_error();
                        }
                        for (i = 0; i < num_elements; i++)
                        {
                            int k;

                            fi_printf("(");
                            for (k = 0; k < num_dims; k++)
                            {
                                ff_printf("%d", index[k]);
                                if (k < num_dims - 1)
                                {
                                    ff_printf(",");
                                }
                            }
                            ff_printf(")");
                            if (print_offsets)
                            {
                                int64_t offset;

                                if (coda_cursor_get_file_bit_offset(cursor, &offset) != 0)
                                {
                                    handle_coda_error();
                                }
                                if (offset >= 0)
                                {
                                    char s[21];

                                    coda_str64(offset >> 3, s);
                                    ff_printf(":%s", s);
                                    if ((offset & 0x7) != 0)
                                    {
                                        ff_printf(":%d", (int)(offset & 0x7));
                                    }
                                }
                            }
                            ff_printf("\n");
                            INDENT++;
                            if (max_depth < 0 || depth < max_depth)
                            {
                                print_data(cursor, depth + 1);
                            }
                            else
                            {
                                fi_printf("...\n");
                            }
                            INDENT--;

                            k = num_dims - 1;
                            while (k >= 0)
                            {
                                index[k]++;
                                if (index[k] == dim[k])
                                {
                                    index[k--] = 0;
                                }
                                else
                                {
                                    break;
                                }
                            }
                            if (i < num_elements - 1)
                            {
                                if (coda_cursor_goto_next_array_element(cursor) != 0)
                                {
                                    handle_coda_error();
                                }
                            }
                        }
                        coda_cursor_goto_parent(cursor);
                    }
                }
            }
            break;
        case coda_integer_class:
        case coda_real_class:
        case coda_text_class:
        case coda_raw_class:
            {
                coda_native_type read_type;
                int has_ascii_content;

                if (coda_cursor_has_ascii_content(cursor, &has_ascii_content) != 0)
                {
                    handle_coda_error();
                }
                if (has_ascii_content)
                {
                    long length;
                    char *data;

                    if (coda_cursor_get_string_length(cursor, &length) != 0)
                    {
                        handle_coda_error();
                    }
                    data = (char *)malloc(length + 1);
                    if (data == NULL)
                    {
                        coda_set_error(CODA_ERROR_OUT_OF_MEMORY,
                                       "out of memory (could not allocate %lu bytes) (%s:%u)",
                                       (long)length + 1, __FILE__, __LINE__);
                        handle_coda_error();
                    }
                    if (coda_cursor_read_string(cursor, data, length + 1) != 0)
                    {
                        handle_coda_error();
                    }

                    fi_printf("\"");
                    print_escaped(data, length);
                    ff_printf("\" (length=%ld)\n", length);
                    free(data);
                }

                if (coda_cursor_get_read_type(cursor, &read_type) != 0)
                {
                    handle_coda_error();
                }
                switch (read_type)
                {
                    case coda_native_type_bytes:
                        {
                            int64_t bit_size;
                            int64_t byte_size;
                            uint8_t *data;
                            char s[21];

                            if (coda_cursor_get_bit_size(cursor, &bit_size) != 0)
                            {
                                handle_coda_error();
                            }
                            byte_size = (bit_size >> 3) + (bit_size & 0x7 ? 1 : 0);
                            data = (uint8_t *)malloc((size_t)byte_size);
                            if (data == NULL)
                            {
                                coda_set_error(CODA_ERROR_OUT_OF_MEMORY,
                                               "out of memory (could not allocate %lu bytes) (%s:%u)",
                                               (long)byte_size, __FILE__, __LINE__);
                                handle_coda_error();
                            }
                            if (coda_cursor_read_bits(cursor, data, 0, bit_size) != 0)
                            {
                                handle_coda_error();
                            }

                            fi_printf("\"");
                            print_escaped((char *)data, (long)byte_size);
                            ff_printf("\" (size=");
                            coda_str64(bit_size >> 3, s);
                            ff_printf("%s", s);
                            if ((bit_size & 0x7) != 0)
                            {
                                ff_printf(":%d", (int)(bit_size & 0x7));
                            }
                            ff_printf(")\n");

                            free(data);
                        }
                        break;
                    case coda_native_type_int8:
                    case coda_native_type_int16:
                    case coda_native_type_int32:
                        {
                            int32_t data;

                            if (coda_cursor_read_int32(cursor, &data) != 0)
                            {
                                handle_coda_error();
                            }

                            fi_printf("%ld\n", (long)data);
                        }
                        break;
                    case coda_native_type_uint8:
                    case coda_native_type_uint16:
                    case coda_native_type_uint32:
                        {
                            uint32_t data;

                            if (coda_cursor_read_uint32(cursor, &data) != 0)
                            {
                                handle_coda_error();
                            }

                            fi_printf("%lu\n", (unsigned long)data);
                        }
                        break;
                    case coda_native_type_int64:
                        {
                            int64_t data;
                            char s[21];

                            if (coda_cursor_read_int64(cursor, &data) != 0)
                            {
                                handle_coda_error();
                            }

                            coda_str64(data, s);
                            fi_printf("%s\n", s);
                        }
                        break;
                    case coda_native_type_uint64:
                        {
                            uint64_t data;
                            char s[21];

                            if (coda_cursor_read_uint64(cursor, &data) != 0)
                            {
                                handle_coda_error();
                            }

                            coda_str64u(data, s);
                            fi_printf("%s\n", s);
                        }
                        break;
                    case coda_native_type_float:
                    case coda_native_type_double:
                        {
                            double data;

                            if (coda_cursor_read_double(cursor, &data) != 0)
                            {
                                handle_coda_error();
                            }

                            if (read_type == coda_native_type_float)
                            {
                                fi_printf("%.7g\n", data);
                            }
                            else
                            {
                                fi_printf("%.16g\n", data);
                            }
                        }
                        break;
                    case coda_native_type_char:
                    case coda_native_type_string:
                    case coda_native_type_not_available:
                        assert(has_ascii_content);
                        break;
                }
            }
            break;
        case coda_special_class:
            {
                coda_special_type special_type;

                if (coda_cursor_get_special_type(cursor, &special_type) != 0)
                {
                    handle_coda_error();
                }

                if (special_type != coda_special_no_data)
                {
                    coda_cursor base_cursor = *cursor;

                    if (coda_cursor_use_base_type_of_special_type(&base_cursor) != 0)
                    {
                        handle_coda_error();
                    }
                    print_data(&base_cursor, depth);
                }

                fi_printf("<%s>", coda_type_get_special_type_name(special_type));
                switch (special_type)
                {
                    case coda_special_no_data:
                        ff_printf("\n");
                        break;
                    case coda_special_vsf_integer:
                        {
                            double data;

                            if (coda_cursor_read_double(cursor, &data) != 0)
                            {
                                handle_coda_error();
                            }

                            ff_printf("%.16g\n", data);
                        }
                        break;
                    case coda_special_time:
                        {
                            double data;
                            char str[27];

                            if (coda_cursor_read_double(cursor, &data) != 0)
                            {
                                handle_coda_error();
                            }
                            if (coda_isNaN(data) || coda_isInf(data))
                            {
                                ff_printf(" %.16g\n", data);
                            }
                            else
                            {
                                if (coda_time_double_to_string(data, "yyyy-MM-dd HH:mm:ss.SSSSSS", str) != 0)
                                {
                                    ff_printf(" {--invalid time value--}\n");
                                }
                                else
                                {
                                    ff_printf(" %s\n", str);
                                }
                            }
                        }
                        break;
                    case coda_special_complex:
                        {
                            double re, im;

                            if (coda_cursor_read_complex_double_split(cursor, &re, &im) != 0)
                            {
                                handle_coda_error();
                            }

                            ff_printf(" %g + %gi\n", re, im);
                        }
                        break;
                }
            }
            break;
    }
}